

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
          (TransitionObservationIndependentMADPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs)

{
  ulong uVar1;
  ulong uVar2;
  MultiAgentDecisionProcessDiscrete *pMVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  long *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sucSIs;
  Index in_stack_ffffffffffffff7c;
  value_type in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff84;
  allocator_type *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_38;
  
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x10))();
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8f80e7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8f8107);
  local_38 = 0;
  while( true ) {
    uVar1 = (ulong)local_38;
    uVar2 = (**(code **)(*in_RSI + 0x10))();
    if (uVar2 <= uVar1) break;
    pMVar3 = GetIndividualMADPD((TransitionObservationIndependentMADPDiscrete *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff7c);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDX,(ulong)local_38);
    in_stack_ffffffffffffff80 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RCX,(ulong)local_38);
    in_stack_ffffffffffffff84 =
         (**(code **)(*(long *)&pMVar3->super_MultiAgentDecisionProcess + 0x138))
                   (pMVar3,in_stack_ffffffffffffff80,*pvVar4);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_38);
    *pvVar5 = in_stack_ffffffffffffff84;
    local_38 = local_38 + 1;
  }
  return this_00;
}

Assistant:

std::vector<Index> SampleSuccessorState(const std::vector<Index> &sIs,
                                             const std::vector<Index> &aIs)
        const
        {
            std::vector<Index> sucSIs(GetNrAgents());
            for(Index agI = 0; agI < GetNrAgents(); agI++)
                sucSIs[agI]=GetIndividualMADPD(agI)->SampleSuccessorState(sIs[agI],
                                                                          aIs[agI]);
            return(sucSIs);
        }